

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void Memory::Recycler::WBVerifyBitIsSet(char *addr,char *target)

{
  HeapBlock *pHVar1;
  Recycler *pRVar2;
  
  CCLock::Enter(&recyclerListLock.super_CCLock);
  if (recyclerList != (Recycler *)0x0) {
    pRVar2 = recyclerList;
    do {
      if (((char *)0xffff < addr) &&
         (pHVar1 = HeapBlockMap64::GetHeapBlock
                             (&pRVar2->heapBlockMap,(void *)((ulong)addr & 0xfffffffffffffff0)),
         pHVar1 != (HeapBlock *)0x0)) {
        (*pHVar1->_vptr_HeapBlock[3])(pHVar1,addr);
        break;
      }
      pRVar2 = pRVar2->next;
    } while (pRVar2 != (Recycler *)0x0);
  }
  CCLock::Leave(&recyclerListLock.super_CCLock);
  return;
}

Assistant:

void
Recycler::WBVerifyBitIsSet(char* addr, char* target)
{
    AutoCriticalSection lock(&recyclerListLock);
    Recycler* recycler = Recycler::recyclerList;
    while (recycler)
    {
        auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
        if (heapBlock)
        {
            heapBlock->WBVerifyBitIsSet(addr);
            break;
        }
        recycler = recycler->next;
    }
}